

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 __thiscall DROPlayer::LoadFile(DROPlayer *this,DATA_LOADER *dataLoader)

{
  UINT8 UVar1;
  ushort uVar2;
  bool bVar3;
  UINT16 UVar4;
  UINT32 UVar5;
  UINT8 *pUVar6;
  bool bVar7;
  UINT8 local_54;
  value_type local_40 [8];
  reference local_38;
  UINT32 local_24;
  DATA_LOADER *pDStack_20;
  UINT32 tempLng;
  DATA_LOADER *dataLoader_local;
  DROPlayer *this_local;
  
  this->_dLoad = (DATA_LOADER *)0x0;
  pDStack_20 = dataLoader;
  dataLoader_local = (DATA_LOADER *)this;
  DataLoader_ReadUntil(dataLoader,0x10);
  pUVar6 = DataLoader_GetData(pDStack_20);
  this->_fileData = pUVar6;
  UVar5 = DataLoader_GetSize(pDStack_20);
  if ((UVar5 < 0x10) || (*(long *)this->_fileData != 0x4c504f5741524244)) {
    this_local._7_1_ = 0xf0;
  }
  else {
    local_24 = ReadLE32(this->_fileData + 8);
    if ((local_24 & 0xff00ff00) == 0) {
      if ((local_24 & 0xffff) == 0) {
        UVar4 = ReadLE16(this->_fileData + 8);
        (this->_fileHdr).verMinor = UVar4;
        UVar4 = ReadLE16(this->_fileData + 10);
        (this->_fileHdr).verMajor = UVar4;
      }
      else {
        UVar4 = ReadLE16(this->_fileData + 8);
        (this->_fileHdr).verMajor = UVar4;
        UVar4 = ReadLE16(this->_fileData + 10);
        (this->_fileHdr).verMinor = UVar4;
      }
    }
    else {
      (this->_fileHdr).verMajor = 0;
      (this->_fileHdr).verMinor = 0;
    }
    if ((this->_fileHdr).verMajor < 3) {
      this->_dLoad = pDStack_20;
      DataLoader_ReadAll(this->_dLoad);
      pUVar6 = DataLoader_GetData(this->_dLoad);
      this->_fileData = pUVar6;
      uVar2 = (this->_fileHdr).verMajor;
      if (uVar2 < 2) {
        UVar4 = (this->_fileHdr).verMajor;
        if (UVar4 == 0) {
          UVar5 = ReadLE32(this->_fileData + 8);
          (this->_fileHdr).lengthMS = UVar5;
          UVar5 = ReadLE32(this->_fileData + 0xc);
          (this->_fileHdr).dataSize = UVar5;
          (this->_fileHdr).hwType = this->_fileData[0x10];
          (this->_fileHdr).dataOfs = 0x11;
        }
        else if (UVar4 == 1) {
          UVar5 = ReadLE32(this->_fileData + 0xc);
          (this->_fileHdr).lengthMS = UVar5;
          UVar5 = ReadLE32(this->_fileData + 0x10);
          (this->_fileHdr).dataSize = UVar5;
          local_24 = ReadLE32(this->_fileData + 0x14);
          if (local_24 < 0x100) {
            local_54 = (UINT8)local_24;
          }
          else {
            local_54 = 0xff;
          }
          (this->_fileHdr).hwType = local_54;
          (this->_fileHdr).dataOfs = 0x18;
        }
        if ((this->_fileHdr).hwType == '\x01') {
          (this->_fileHdr).hwType = '\x02';
        }
        else if ((this->_fileHdr).hwType == '\x02') {
          (this->_fileHdr).hwType = '\x01';
        }
        (this->_fileHdr).format = '\0';
        (this->_fileHdr).compression = '\0';
        (this->_fileHdr).cmdDlyShort = '\0';
        (this->_fileHdr).cmdDlyLong = '\x01';
        (this->_fileHdr).regCmdCnt = '\0';
      }
      else if (uVar2 == 2) {
        UVar5 = ReadLE32(this->_fileData + 0xc);
        (this->_fileHdr).dataSize = UVar5 << 1;
        UVar5 = ReadLE32(this->_fileData + 0x10);
        (this->_fileHdr).lengthMS = UVar5;
        (this->_fileHdr).hwType = this->_fileData[0x14];
        (this->_fileHdr).format = this->_fileData[0x15];
        (this->_fileHdr).compression = this->_fileData[0x16];
        (this->_fileHdr).cmdDlyShort = this->_fileData[0x17];
        (this->_fileHdr).cmdDlyLong = this->_fileData[0x18];
        (this->_fileHdr).regCmdCnt = this->_fileData[0x19];
        (this->_fileHdr).dataOfs = (this->_fileHdr).regCmdCnt + 0x1a;
        if (0x80 < (this->_fileHdr).regCmdCnt) {
          (this->_fileHdr).regCmdCnt = 0x80;
        }
        memcpy((this->_fileHdr).regCmdMap,this->_fileData + 0x1a,(ulong)(this->_fileHdr).regCmdCnt);
      }
      ScanInitBlock(this);
      this->_realHwType = (this->_fileHdr).hwType;
      if ((1 < (this->_fileHdr).verMajor) && (this->_realHwType == '\x01')) {
        UVar1 = (this->_playOpts).v2opl3Mode;
        if (UVar1 == '\0') {
          local_38 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->_initRegSet,0x105);
          bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_38);
          bVar7 = false;
          if (bVar3) {
            bVar7 = (this->_initOPL3Enable & 1) != 0;
          }
          if (bVar7) {
            this->_realHwType = '\x02';
          }
        }
        else if ((UVar1 != '\x01') && (UVar1 == '\x02')) {
          this->_realHwType = '\x02';
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_devTypes);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_devPanning);
      this->_portShift = '\0';
      if (this->_realHwType == '\0') {
        local_40[7] = 9;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->_devTypes,local_40 + 7);
        local_40[6] = 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->_devPanning,local_40 + 6);
      }
      else if (this->_realHwType == '\x01') {
        local_40[5] = 9;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->_devTypes,local_40 + 5);
        local_40[4] = 1;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->_devPanning,local_40 + 4);
        local_40[3] = 9;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->_devTypes,local_40 + 3);
        local_40[2] = 2;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->_devPanning,local_40 + 2);
      }
      else {
        local_40[1] = 0xc;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->_devTypes,local_40 + 1);
        local_40[0] = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->_devPanning,local_40);
        this->_portShift = '\x01';
      }
      this->_portMask = (char)(1 << (this->_portShift & 0x1f)) + 0xff;
      this->_totalTicks = (this->_fileHdr).lengthMS;
      GenerateDeviceConfig(this);
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = 0xf1;
    }
  }
  return this_local._7_1_;
}

Assistant:

UINT8 DROPlayer::LoadFile(DATA_LOADER *dataLoader)
{
	UINT32 tempLng;
	
	_dLoad = NULL;
	DataLoader_ReadUntil(dataLoader,0x10);
	_fileData = DataLoader_GetData(dataLoader);
	if (DataLoader_GetSize(dataLoader) < 0x10 || memcmp(&_fileData[0x00], "DBRAWOPL", 8))
		return 0xF0;	// invalid file
	
	// --- try to detect the DRO version ---
	tempLng = ReadLE32(&_fileData[0x08]);
	if (tempLng & 0xFF00FF00)
	{
		// DRO v0 - This version didn't write version bytes.
		_fileHdr.verMajor = 0x00;
		_fileHdr.verMinor = 0x00;
	}
	else if (! (tempLng & 0x0000FFFF))
	{
		// DRO v1 - order is: minor, major
		_fileHdr.verMinor = ReadLE16(&_fileData[0x08]);
		_fileHdr.verMajor = ReadLE16(&_fileData[0x0A]);
	}
	else
	{
		// DRO v2 - order is: major, minor
		_fileHdr.verMajor = ReadLE16(&_fileData[0x08]);
		_fileHdr.verMinor = ReadLE16(&_fileData[0x0A]);
	}
	if (_fileHdr.verMajor > 2)
		return 0xF1;	// unsupported version
	
	_dLoad = dataLoader;
	DataLoader_ReadAll(_dLoad);
	_fileData = DataLoader_GetData(_dLoad);
	
	switch(_fileHdr.verMajor)
	{
	case 0:	// version 0 (DOSBox 0.62)
	case 1:	// version 1 (DOSBox 0.63)
		switch(_fileHdr.verMajor)
		{
		case 0:
			_fileHdr.lengthMS = ReadLE32(&_fileData[0x08]);
			_fileHdr.dataSize = ReadLE32(&_fileData[0x0C]);
			_fileHdr.hwType = _fileData[0x10];
			_fileHdr.dataOfs = 0x11;
			break;
		case 1:
			_fileHdr.lengthMS = ReadLE32(&_fileData[0x0C]);
			_fileHdr.dataSize = ReadLE32(&_fileData[0x10]);
			tempLng = ReadLE32(&_fileData[0x14]);
			_fileHdr.hwType = (tempLng <= 0xFF) ? (UINT8)tempLng : 0xFF;
			_fileHdr.dataOfs = 0x18;
			break;
		}
		// swap DualOPL2 and OPL3 values
		if (_fileHdr.hwType == 0x01)
			_fileHdr.hwType = DROHW_OPL3;
		else if (_fileHdr.hwType == 0x02)
			_fileHdr.hwType = DROHW_DUALOPL2;
		_fileHdr.format = 0x00;
		_fileHdr.compression = 0x00;
		_fileHdr.cmdDlyShort = 0x00;
		_fileHdr.cmdDlyLong = 0x01;
		_fileHdr.regCmdCnt = 0x00;
		break;
	case 2:	// version 2 (DOSBox 0.73)
		_fileHdr.dataSize = ReadLE32(&_fileData[0x0C]) * 2;
		_fileHdr.lengthMS = ReadLE32(&_fileData[0x10]);
		_fileHdr.hwType = _fileData[0x14];
		_fileHdr.format = _fileData[0x15];
		_fileHdr.compression = _fileData[0x16];
		_fileHdr.cmdDlyShort = _fileData[0x17];
		_fileHdr.cmdDlyLong = _fileData[0x18];
		_fileHdr.regCmdCnt = _fileData[0x19];
		_fileHdr.dataOfs = 0x1A + _fileHdr.regCmdCnt;
		
		if (_fileHdr.regCmdCnt > 0x80)
			_fileHdr.regCmdCnt = 0x80;	// only 0x80 values are possible
		memcpy(_fileHdr.regCmdMap, &_fileData[0x1A], _fileHdr.regCmdCnt);
		
		break;
	}
	
	ScanInitBlock();
	
	_realHwType = _fileHdr.hwType;
	if (_fileHdr.verMajor >= 2)
	{
		// DOSBox puts "DualOPL2" into the header of DROs that log OPL3 data ...
		// ... unless the "4op enable" register is accessed while OPL3 mode is active.
		// This bug was introduced when DRO logging was rewritten for DOSBox 0.73.
		if (_realHwType == DROHW_DUALOPL2)
		{
			switch(_playOpts.v2opl3Mode)
			{
			case DRO_V2OPL3_DETECT:
				// if OPL3 enable is set, it definitely is an OPL3 file
				if (_initRegSet[0x105] && (_initOPL3Enable & 0x01))
					_realHwType = DROHW_OPL3;
				break;
			case DRO_V2OPL3_HEADER:
				// keep the value from the header
				break;
			case DRO_V2OPL3_ENFORCE:
				_realHwType = DROHW_OPL3;
				break;
			}
		}
	}
	
	_devTypes.clear();
	_devPanning.clear();
	_portShift = 0;
	switch(_realHwType)
	{
	case DROHW_OPL2:	// single OPL2
		_devTypes.push_back(DEVID_YM3812);	_devPanning.push_back(0x00);
		break;
	case DROHW_DUALOPL2:	// dual OPL2
		_devTypes.push_back(DEVID_YM3812);	_devPanning.push_back(0x01);
		_devTypes.push_back(DEVID_YM3812);	_devPanning.push_back(0x02);
		break;
	case DROHW_OPL3:	// single OPL3
	default:
		_devTypes.push_back(DEVID_YMF262);	_devPanning.push_back(0x00);
		_portShift = 1;
		break;
	}
	_portMask = (1 << _portShift) - 1;
	
	_totalTicks = _fileHdr.lengthMS;
	GenerateDeviceConfig();
	
	return 0x00;
}